

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::ParseSubjectKeyIdentifierTest_Valid_Test::TestBody
          (ParseSubjectKeyIdentifierTest_Valid_Test *this)

{
  bool bVar1;
  Input *in_RCX;
  pointer *__ptr_2;
  pointer *__ptr;
  char *message;
  char *in_R9;
  Input extension_value;
  uint8_t kExpected [2];
  uint8_t kInput [4];
  Input subject_key_identifier;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  undefined2 local_6a;
  undefined1 auStack_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AssertHelper local_58;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined4 local_2c;
  Input local_28;
  
  local_2c = 0xcdab0204;
  local_6a = 0xcdab;
  local_28.data_.data_ = (uchar *)0x0;
  local_28.data_.size_ = 0;
  extension_value.data_.size_ = (size_t)&local_28;
  extension_value.data_.data_ = &DAT_00000004;
  bVar1 = ParseSubjectKeyIdentifier((bssl *)&local_2c,extension_value,in_RCX);
  auStack_68[0] = bVar1;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)auStack_68,
               (AssertionResult *)
               "ParseSubjectKeyIdentifier(der::Input(kInput), &subject_key_identifier)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
               ,0x49a,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._1_7_,local_50[0]) != &local_40) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_50._1_7_,local_50[0]),local_40._M_allocated_capacity + 1);
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  auStack_68 = (undefined1  [8])&local_6a;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
            ((internal *)local_50,"der::Input(kExpected)","subject_key_identifier",
             (Input *)auStack_68,&local_28);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_68);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
               ,0x49b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)auStack_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (auStack_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auStack_68 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(ParseSubjectKeyIdentifierTest, Valid) {
  // OCTET_STRING {`abcd`}
  const uint8_t kInput[] = {0x04, 0x02, 0xab, 0xcd};
  const uint8_t kExpected[] = {0xab, 0xcd};
  der::Input subject_key_identifier;
  EXPECT_TRUE(
      ParseSubjectKeyIdentifier(der::Input(kInput), &subject_key_identifier));
  EXPECT_EQ(der::Input(kExpected), subject_key_identifier);
}